

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O0

void __thiscall Handlers::Handlers(Handlers *this)

{
  Handlers *this_local;
  
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::function(&this->any_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->null_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->string_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->number_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&this->bool_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::function(&this->dict_start_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->dict_end_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
  ::function(&this->array_start_handler,(nullptr_t)0x0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->array_end_handler,(nullptr_t)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<JSONHandler>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<JSONHandler>_>_>_>
  ::map(&this->dict_handlers);
  std::shared_ptr<JSONHandler>::shared_ptr(&this->fallback_dict_handler);
  std::shared_ptr<JSONHandler>::shared_ptr(&this->array_item_handler);
  std::shared_ptr<JSONHandler>::shared_ptr(&this->fallback_handler);
  return;
}

Assistant:

Handlers() = default;